

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O3

void __thiscall tcmalloc::PageHeap::CommitSpan(PageHeap *this,Span *span)

{
  uint64_t *puVar1;
  long lVar2;
  
  puVar1 = &(this->stats_).commit_count;
  *puVar1 = *puVar1 + 1;
  TCMalloc_SystemCommit((void *)(span->start << 0xd),span->length << 0xd);
  lVar2 = span->length * 0x2000;
  puVar1 = &(this->stats_).committed_bytes;
  *puVar1 = *puVar1 + lVar2;
  puVar1 = &(this->stats_).total_commit_bytes;
  *puVar1 = *puVar1 + lVar2;
  return;
}

Assistant:

void PageHeap::CommitSpan(Span* span) {
  ++stats_.commit_count;

  TCMalloc_SystemCommit(reinterpret_cast<void*>(span->start << kPageShift),
                        static_cast<size_t>(span->length << kPageShift));
  stats_.committed_bytes += span->length << kPageShift;
  stats_.total_commit_bytes += (span->length << kPageShift);
}